

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma2_encoder.c
# Opt level: O0

void lzma2_header_lzma(lzma_coder_conflict7 *coder)

{
  long lVar1;
  size_t size;
  size_t pos;
  lzma_coder_conflict7 *coder_local;
  
  if (coder->uncompressed_size == 0) {
    __assert_fail("coder->uncompressed_size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                  ,0x3c,"void lzma2_header_lzma(lzma_coder *)");
  }
  if (0x200000 < coder->uncompressed_size) {
    __assert_fail("coder->uncompressed_size <= LZMA2_UNCOMPRESSED_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                  ,0x3d,"void lzma2_header_lzma(lzma_coder *)");
  }
  if (coder->compressed_size == 0) {
    __assert_fail("coder->compressed_size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                  ,0x3e,"void lzma2_header_lzma(lzma_coder *)");
  }
  if (0x10000 < coder->compressed_size) {
    __assert_fail("coder->compressed_size <= LZMA2_CHUNK_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                  ,0x3f,"void lzma2_header_lzma(lzma_coder *)");
  }
  if ((coder->need_properties & 1U) == 0) {
    size = 1;
    if ((coder->need_state_reset & 1U) == 0) {
      coder->buf[1] = 0x80;
    }
    else {
      coder->buf[1] = 0xa0;
    }
  }
  else {
    size = 0;
    if ((coder->need_dictionary_reset & 1U) == 0) {
      coder->buf[0] = 0xc0;
    }
    else {
      coder->buf[0] = 0xe0;
    }
  }
  coder->buf_pos = size;
  lVar1 = coder->uncompressed_size - 1;
  coder->buf[size] = coder->buf[size] + (char)((ulong)lVar1 >> 0x10);
  coder->buf[size + 1] = (uint8_t)((ulong)lVar1 >> 8);
  coder->buf[size + 2] = (uint8_t)lVar1;
  lVar1 = coder->compressed_size - 1;
  coder->buf[size + 3] = (uint8_t)((ulong)lVar1 >> 8);
  coder->buf[size + 4] = (uint8_t)lVar1;
  if ((coder->need_properties & 1U) != 0) {
    lzma_lzma_lclppb_encode(&coder->opt_cur,coder->buf + size + 5);
  }
  coder->need_properties = false;
  coder->need_state_reset = false;
  coder->need_dictionary_reset = false;
  coder->compressed_size = coder->compressed_size + 6;
  return;
}

Assistant:

static void
lzma2_header_lzma(lzma_coder *coder)
{
	size_t pos;
	size_t size;

	assert(coder->uncompressed_size > 0);
	assert(coder->uncompressed_size <= LZMA2_UNCOMPRESSED_MAX);
	assert(coder->compressed_size > 0);
	assert(coder->compressed_size <= LZMA2_CHUNK_MAX);

	if (coder->need_properties) {
		pos = 0;

		if (coder->need_dictionary_reset)
			coder->buf[pos] = 0x80 + (3 << 5);
		else
			coder->buf[pos] = 0x80 + (2 << 5);
	} else {
		pos = 1;

		if (coder->need_state_reset)
			coder->buf[pos] = 0x80 + (1 << 5);
		else
			coder->buf[pos] = 0x80;
	}

	// Set the start position for copying.
	coder->buf_pos = pos;

	// Uncompressed size
	size = coder->uncompressed_size - 1;
	coder->buf[pos++] += size >> 16;
	coder->buf[pos++] = (size >> 8) & 0xFF;
	coder->buf[pos++] = size & 0xFF;

	// Compressed size
	size = coder->compressed_size - 1;
	coder->buf[pos++] = size >> 8;
	coder->buf[pos++] = size & 0xFF;

	// Properties, if needed
	if (coder->need_properties)
		lzma_lzma_lclppb_encode(&coder->opt_cur, coder->buf + pos);

	coder->need_properties = false;
	coder->need_state_reset = false;
	coder->need_dictionary_reset = false;

	// The copying code uses coder->compressed_size to indicate the end
	// of coder->buf[], so we need add the maximum size of the header here.
	coder->compressed_size += LZMA2_HEADER_MAX;

	return;
}